

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeCreator.hpp
# Opt level: O2

void __thiscall OpenMD::LatticeCreator::~LatticeCreator(LatticeCreator *this)

{
  this->_vptr_LatticeCreator = (_func_int **)&PTR__LatticeCreator_002bda00;
  std::__cxx11::string::~string((string *)&this->ident_);
  return;
}

Assistant:

virtual ~LatticeCreator() = default;